

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O0

void __thiscall ir_tree_visitor::add_class_symbols(ir_tree_visitor *this,string *class_name)

{
  bool bVar1;
  int iVar2;
  mapped_type *ppBVar3;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *this_01;
  MemExpression *this_02;
  Expression *expression;
  mapped_type *this_03;
  AddressInFrame *this_04;
  size_t sVar4;
  mapped_type *pmVar5;
  AddressInFrame *local_78;
  MemExpression *local_70;
  MemExpression *this_addr;
  VariableSymbol **symbol_1;
  iterator __end1;
  iterator __begin1;
  vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *__range1;
  size_t offset;
  ClassSymbol *class_symbol;
  allocator<char> local_21;
  mapped_type local_20;
  mapped_type symbol;
  string *class_name_local;
  ir_tree_visitor *this_local;
  
  symbol = (mapped_type)class_name;
  class_name_local = (string *)this;
  ppBVar3 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>_>
            ::operator[](&this->curr_scope->symbols,class_name);
  local_20 = *ppBVar3;
  iVar2 = (**local_20->_vptr_BaseSymbol)();
  if (iVar2 != 0) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,"unknown error\n",&local_21);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  __range1 = (vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *)0x0;
  this_01 = &local_20[1].name.field_2;
  __end1 = std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>::begin
                     ((vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *)this_01);
  symbol_1 = (VariableSymbol **)
             std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>::end
                       ((vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *)this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
                                *)&symbol_1);
    if (!bVar1) break;
    this_addr = (MemExpression *)
                __gnu_cxx::
                __normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
                ::operator*(&__end1);
    this_02 = (MemExpression *)operator_new(0x10);
    expression = IRT::AddressInRegister::ToExpression(&this->frame_pointer_address);
    IRT::MemExpression::MemExpression(this_02,expression);
    local_70 = this_02;
    this_03 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>_>
              ::operator[](&this->addresses,
                           (key_type *)
                           ((this_addr->super_Expression).super_BaseElement._vptr_BaseElement + 1));
    this_04 = (AddressInFrame *)operator_new(0x20);
    IRT::AddressInFrame::AddressInFrame(this_04,&local_70->super_Expression,(int)__range1);
    local_78 = this_04;
    std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>::push
              (this_03,(value_type *)&local_78);
    sVar4 = get_size((Type *)(this_addr->super_Expression).super_BaseElement._vptr_BaseElement[5]);
    __range1 = (vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *)
               ((long)&(__range1->
                       super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar4);
    __gnu_cxx::
    __normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
    ::operator++(&__end1);
  }
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->class_sizes,(key_type *)symbol);
  *pmVar5 = (mapped_type)__range1;
  return;
}

Assistant:

void ir_tree_visitor::add_class_symbols(std::string* class_name) {
    auto symbol = curr_scope->symbols[*class_name];
    if (symbol->SymbolType() != SYMBOL_CLASS) {
        throw std::string("unknown error\n");
    }
    auto class_symbol = reinterpret_cast<ClassSymbol*>(symbol);

    size_t offset = 0;
    for (auto& symbol: class_symbol->fields) {
        auto this_addr = new IRT::MemExpression(frame_pointer_address.ToExpression());
        addresses[symbol->name].push(new IRT::AddressInFrame(this_addr, offset));
        offset += get_size(symbol->type);
    }
    class_sizes[*class_name] = offset;
}